

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O0

void __thiscall Assimp::ObjFile::Face::~Face(Face *this)

{
  Face *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_texturCoords);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_normals);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_vertices);
  return;
}

Assistant:

~Face() {
        // empty
    }